

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearDecayCorrelationModel.h
# Opt level: O2

void __thiscall
csm::LinearDecayCorrelationModel::Parameters::Parameters
          (Parameters *this,vector<double,_std::allocator<double>_> *initialCorrsPerSegment,
          vector<double,_std::allocator<double>_> *timesPerSegment)

{
  std::vector<double,_std::allocator<double>_>::vector
            (&this->theInitialCorrsPerSegment,initialCorrsPerSegment);
  std::vector<double,_std::allocator<double>_>::vector(&this->theTimesPerSegment,timesPerSegment);
  return;
}

Assistant:

Parameters(const std::vector<double>& initialCorrsPerSegment,
                 const std::vector<double>& timesPerSegment)
         : theInitialCorrsPerSegment(initialCorrsPerSegment),
           theTimesPerSegment(timesPerSegment) {}